

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

int av1_txfm_uvrd(AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_stats,BLOCK_SIZE bsize,
                 int64_t ref_best_rd)

{
  BLOCK_SIZE BVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  undefined1 in_CL;
  RD_STATS *in_RDX;
  long in_RSI;
  RD_STATS *in_RDI;
  long in_R8;
  MACROBLOCK *unaff_retaddr;
  BLOCK_SIZE in_stack_00000010;
  TX_SIZE in_stack_00000018;
  FAST_TX_SEARCH_MODE in_stack_00000020;
  int in_stack_00000028;
  int64_t chroma_ref_best_rd;
  RD_STATS this_rd_stats;
  int plane_1;
  int is_cost_valid;
  TX_SIZE uv_tx_size;
  int skip_trellis;
  int plane;
  BLOCK_SIZE plane_bsize;
  int64_t skip_txfm_rd;
  int64_t this_rd;
  int is_inter;
  macroblockd_plane *pd;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  long local_c0;
  undefined8 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int local_78;
  int local_74;
  int local_68;
  undefined3 in_stack_ffffffffffffffdc;
  int plane_00;
  long ref_best_rd_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  plane_00 = CONCAT13(in_CL,in_stack_ffffffffffffffdc);
  av1_init_rd_stats(in_RDX);
  if (in_R8 < 0) {
    local_74 = 0;
  }
  else if ((*(byte *)(in_RSI + 0x1ac) & 1) == 0) {
    local_74 = 1;
  }
  else {
    ref_best_rd_00 = in_RSI;
    iVar3 = is_inter_block((MB_MODE_INFO *)
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    BVar1 = get_plane_block_size
                      ((BLOCK_SIZE)((uint)plane_00 >> 0x18),*(int *)(in_RSI + 0xbe4),
                       *(int *)(in_RSI + 0xbe8));
    if (iVar3 != 0) {
      for (local_68 = 1; local_68 < 3; local_68 = local_68 + 1) {
        av1_subtract_plane((MACROBLOCK *)
                           CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           (BLOCK_SIZE)((ulong)in_stack_ffffffffffffff58 >> 0x38),
                           (int)in_stack_ffffffffffffff58);
      }
    }
    bVar2 = av1_get_tx_size(in_stack_ffffffffffffff30,
                            (MACROBLOCKD *)
                            CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    local_74 = 1;
    for (local_78 = 1; local_78 < 3; local_78 = local_78 + 1) {
      uVar4 = (uint)BVar1;
      uVar5 = (uint)bVar2;
      av1_txfm_rd_in_plane
                (unaff_retaddr,
                 (AV1_COMP *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                 ref_best_rd_00,(int64_t)in_RDX,plane_00,in_stack_00000010,in_stack_00000018,
                 in_stack_00000020,in_stack_00000028);
      if (in_stack_ffffffffffffff60 == 0x7fffffff) {
        local_74 = 0;
        break;
      }
      av1_merge_rd_stats((RD_STATS *)CONCAT44(in_stack_ffffffffffffff24,uVar5),
                         (RD_STATS *)CONCAT44(in_stack_ffffffffffffff1c,uVar4));
      lVar6 = ((long)in_RDX->rate * (long)*(int *)(ref_best_rd_00 + 0x4218) + 0x100 >> 9) +
              in_RDX->dist * 0x80;
      local_c0 = in_RDX->sse * 0x80;
      if (lVar6 < local_c0) {
        local_c0 = lVar6;
      }
      if (in_R8 < local_c0) {
        local_74 = 0;
        break;
      }
    }
    if (local_74 == 0) {
      av1_invalid_rd_stats(in_RDX);
    }
  }
  return local_74;
}

Assistant:

int av1_txfm_uvrd(const AV1_COMP *const cpi, MACROBLOCK *x, RD_STATS *rd_stats,
                  BLOCK_SIZE bsize, int64_t ref_best_rd) {
  av1_init_rd_stats(rd_stats);
  if (ref_best_rd < 0) return 0;
  if (!x->e_mbd.is_chroma_ref) return 1;

  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  struct macroblockd_plane *const pd = &xd->plane[AOM_PLANE_U];
  const int is_inter = is_inter_block(mbmi);
  int64_t this_rd = 0, skip_txfm_rd = 0;
  const BLOCK_SIZE plane_bsize =
      get_plane_block_size(bsize, pd->subsampling_x, pd->subsampling_y);

  if (is_inter) {
    for (int plane = 1; plane < MAX_MB_PLANE; ++plane)
      av1_subtract_plane(x, plane_bsize, plane);
  }

  const int skip_trellis = 0;
  const TX_SIZE uv_tx_size = av1_get_tx_size(AOM_PLANE_U, xd);
  int is_cost_valid = 1;
  for (int plane = 1; plane < MAX_MB_PLANE; ++plane) {
    RD_STATS this_rd_stats;
    int64_t chroma_ref_best_rd = ref_best_rd;
    // For inter blocks, refined ref_best_rd is used for early exit
    // For intra blocks, even though current rd crosses ref_best_rd, early
    // exit is not recommended as current rd is used for gating subsequent
    // modes as well (say, for angular modes)
    // TODO(any): Extend the early exit mechanism for intra modes as well
    if (cpi->sf.inter_sf.perform_best_rd_based_gating_for_chroma && is_inter &&
        chroma_ref_best_rd != INT64_MAX)
      chroma_ref_best_rd = ref_best_rd - AOMMIN(this_rd, skip_txfm_rd);
    av1_txfm_rd_in_plane(x, cpi, &this_rd_stats, chroma_ref_best_rd, 0, plane,
                         plane_bsize, uv_tx_size, FTXS_NONE, skip_trellis);
    if (this_rd_stats.rate == INT_MAX) {
      is_cost_valid = 0;
      break;
    }
    av1_merge_rd_stats(rd_stats, &this_rd_stats);
    this_rd = RDCOST(x->rdmult, rd_stats->rate, rd_stats->dist);
    skip_txfm_rd = RDCOST(x->rdmult, 0, rd_stats->sse);
    if (AOMMIN(this_rd, skip_txfm_rd) > ref_best_rd) {
      is_cost_valid = 0;
      break;
    }
  }

  if (!is_cost_valid) {
    // reset cost value
    av1_invalid_rd_stats(rd_stats);
  }

  return is_cost_valid;
}